

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall UtilTest_SystemError_Test::TestBody(UtilTest_SystemError_Test *this)

{
  bool bVar1;
  char *message;
  pointer message_00;
  string_view message_01;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  AssertionResult gtest_ar;
  system_error e;
  AssertionResult gtest_ar_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  internal local_290 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  string local_280;
  system_error local_260;
  undefined1 local_248 [8];
  size_type sStack_240;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  long lStack_228;
  undefined8 local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218 [15];
  
  message_01.size_ = 4;
  message_01.data_ = "test";
  fmt::v5::system_error::system_error<>(&local_260,0x21,message_01);
  get_system_error_abi_cxx11_(&local_280,0x21);
  sStack_240 = local_280._M_string_length;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str.size_ = 8;
  format_str.data_ = "test: {}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_248;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::__cxx11::string>
                ::TYPES;
  local_230.ptr_ = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str,args,(locale_ref)0x0);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b0,local_230.ptr_,
             (long)&((local_230.ptr_)->_M_dataplus)._M_p + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230.ptr_ != local_218) {
    operator_delete(local_230.ptr_);
  }
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::runtime_error::what();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
            (local_290,"fmt::format(\"test: {}\", get_system_error(33))","e.what()",&local_2b0,
             (char **)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_280._M_dataplus._M_p._4_4_,(int)local_280._M_dataplus._M_p) !=
      &local_280.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_280._M_dataplus._M_p._4_4_,(int)local_280._M_dataplus._M_p));
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x20f,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2b0._M_dataplus._M_p._0_4_ = 0x21;
  local_280._M_dataplus._M_p._0_4_ = local_260.error_code_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_238,"33","e.error_code()",(int *)&local_2b0,(int *)&local_280);
  if (local_238.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2b0);
    if (local_230.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message_00 = "";
    }
    else {
      message_00 = ((local_230.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x210,message_00);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if ((long *)local_2b0._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_2b0._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_2b0._M_dataplus._M_p + 8))();
      }
      local_2b0._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_230,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  check_throw_error<fmt::v5::system_error>(0x21,fmt::v5::format_system_error);
  std::runtime_error::~runtime_error(&local_260.super_runtime_error);
  return;
}

Assistant:

TEST(UtilTest, SystemError) {
  fmt::system_error e(EDOM, "test");
  EXPECT_EQ(fmt::format("test: {}", get_system_error(EDOM)), e.what());
  EXPECT_EQ(EDOM, e.error_code());
  check_throw_error<fmt::system_error>(EDOM, fmt::format_system_error);
}